

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CsvHelper.cpp
# Opt level: O3

int CsvHelper::read_string(char *text,int text_max,size_t start,char *buffer,size_t buffer_max)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  
  if (start < buffer_max) {
    lVar3 = 0;
    do {
      cVar4 = buffer[start];
      if ((cVar4 != '\t') && (cVar4 != ' ')) {
        if (cVar4 != '\"') goto LAB_0019d4ae;
        start = start + 1;
        if (buffer_max <= start) goto LAB_0019d4e8;
        iVar2 = 0;
        uVar1 = start;
        goto LAB_0019d45c;
      }
      start = start + 1;
    } while (buffer_max != start);
  }
  else {
LAB_0019d4ae:
    if (buffer_max <= start) {
LAB_0019d4e8:
      iVar2 = 0;
      goto LAB_0019d4eb;
    }
    iVar2 = 0;
    do {
      cVar4 = buffer[start];
      if ((cVar4 == '\0') || (cVar4 == ',')) goto LAB_0019d4eb;
      if (iVar2 < text_max + -1) {
        text[iVar2] = cVar4;
        iVar2 = iVar2 + 1;
      }
      start = start + 1;
    } while (buffer_max != start);
    lVar3 = (long)iVar2;
  }
  text[lVar3] = '\0';
  goto LAB_0019d4e7;
  while( true ) {
    if (iVar2 < text_max + -1) {
      text[iVar2] = cVar4;
      iVar2 = iVar2 + 1;
    }
    start = uVar1 + lVar3;
    uVar1 = start;
    if (buffer_max <= start) break;
LAB_0019d45c:
    cVar4 = buffer[uVar1];
    if (cVar4 == '\"') {
      start = uVar1 + 1;
      if ((buffer_max <= start) || (buffer[start] != '\"')) break;
      lVar3 = 2;
      cVar4 = '\"';
    }
    else {
      start = uVar1;
      if (cVar4 == '\0') break;
      lVar3 = 1;
    }
  }
LAB_0019d4eb:
  text[iVar2] = '\0';
  if (buffer_max <= start) {
LAB_0019d517:
    return (int)start;
  }
  do {
    cVar4 = buffer[start];
    if ((cVar4 != '\t') && (cVar4 != ' ')) {
      if (cVar4 == ',') {
        start = start + 1;
      }
      goto LAB_0019d517;
    }
    start = start + 1;
  } while (buffer_max != start);
LAB_0019d4e7:
  return (int)buffer_max;
}

Assistant:

int CsvHelper::read_string(char* text, int text_max, size_t start, char const * buffer, size_t buffer_max)
{
    int x = 0;

    /* Skip blanks */
    while (start < buffer_max && (buffer[start] == ' ' || buffer[start] == '\t'))
    {
        start++;
    }

    /* If quoted, copy quoted, else copy */
    if (start < buffer_max && buffer[start] == '"')
    {
#if 0
        if (x < (text_max - 1))
        {
            text[x] = buffer[start];
            x++;
        }
#endif
        start++;
        while (start < buffer_max && buffer[start] != 0)
        {
            if (buffer[start] == '"')
            {
#if 0
                /* Copy the quote and skip it. */
                if (x < (text_max - 1))
                {
                    text[x] = buffer[start];
                    x++;
                }
#endif
                start++;
                /* Test whether there is a double quote */
                if (start < buffer_max && buffer[start] == '"')
                {
                    /* copy the double quote and continue */
                    if (x < (text_max - 1))
                    {
                        text[x] = buffer[start];
                        x++;
                    }
                    start++;
                }
                else
                {
                    /* This was the final quote */
                    break;
                }
            }
            else
            {
                if (x < (text_max - 1))
                {
                    text[x] = buffer[start];
                    x++;
                }
                start++;
            }
        }
    }
    else
    {
        while (start < buffer_max && buffer[start] != 0 && buffer[start] != ',')
        {
            if (x < (text_max - 1))
            {
                text[x] = buffer[start];
                x++;
            }
            start++;
        }
    }
    text[x] = 0;

    /* Skip comma */
    while (start < buffer_max)
    {
        if (buffer[start] == ',')
        {
            start++;
            break;
        }
        else if (buffer[start] == ' ' || buffer[start] == '\t')
        {
            start++;
        }
        else
        {
            break;
        }
    }

    return (int)start;
}